

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O2

void redrawUnit(WINDOW *body,Inmate *inmate,Path *path,float oldPosition)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  TileNode *pTVar7;
  float fVar8;
  
  uVar2 = inmate->currentHealth;
  uVar3 = inmate->maxHealth;
  pTVar7 = path->first;
  init_pair(1,7,0);
  init_pair(10,10,0);
  init_pair(0xb,0xb,0);
  init_pair(9,9,0);
  init_pair(5,5,0);
  for (; oldPosition < (float)pTVar7->location; pTVar7 = pTVar7->next) {
  }
  fVar8 = ((float)uVar2 / (float)uVar3) * 100.0;
  cVar1 = pTVar7->type;
  wbkgd(body,0x100);
  iVar6 = 0xa00;
  if ((fVar8 <= 75.0) && (iVar6 = 0xb00, fVar8 <= 50.0)) {
    iVar6 = (uint)(25.0 < fVar8) * 0x400 + 0x500;
  }
  wbkgd(body,0x100);
  uVar4 = (long)((int)oldPosition + -1) / 0x48;
  getCoordinate::coordinates[0] = (int)uVar4;
  getCoordinate::coordinates[1] = getCoordinate::coordinates[0] * -0x48 + (int)oldPosition + 1;
  iVar5 = wmove(body,uVar4 & 0xffffffff);
  if (iVar5 != -1) {
    waddch(body,(int)cVar1);
  }
  iVar5 = (int)inmate->position + -1;
  getCoordinate::coordinates[0] = iVar5 / 0x48;
  getCoordinate::coordinates[1] = getCoordinate::coordinates[0] * -0x48 + (int)inmate->position + 1;
  wbkgd(body,iVar6,(long)iVar5 % 0x48 & 0xffffffff);
  iVar6 = wmove(body,getCoordinate::coordinates[0],getCoordinate::coordinates[1]);
  if (iVar6 != -1) {
    waddch(body,(int)inmate->type);
  }
  wbkgd(body,0x100);
  return;
}

Assistant:

void redrawUnit(WINDOW *body, struct Inmate *inmate, struct Path *path,
    float oldPosition) {
    int *currentCoordinates = malloc(sizeof(int) * 2);
    int *newCoordinates = malloc(sizeof(int) * 2);
    float hp, mhp, php;
    int setColor = GREEN;
    hp = (float) inmate->currentHealth;
    mhp = (float) inmate->maxHealth;
    php = (hp / mhp) * 100;
    struct TileNode *tNode = path->first;
    char type = tNode->type;

    init_pair(1, COLOR_WHITE, COLOR_BLACK);
    init_pair(GREEN, GREEN, COLOR_BLACK);
    init_pair(YELLOW, YELLOW, COLOR_BLACK);
    init_pair(RED, RED, COLOR_BLACK);
    init_pair(PURPLE, PURPLE, COLOR_BLACK);

    while (oldPosition < ((float) tNode->location)) {
        tNode = tNode->next;
    }
    type = tNode->type;

    wbkgd(body, COLOR_PAIR(1));

    if (php > 75.0) {
        setColor = GREEN;
    } else if (php > 50.0) {
        setColor = YELLOW;
    } else if (php > 25.0) {
        setColor = RED;
    } else {
        setColor = PURPLE;
    }

#ifndef _DEBUG
    /* Print movement debug information if the debug macro has been set */
    mvwprintw(
        body, 0, 1, "%d %d %f %f, %d, %d, %f, %f",
        newCoordinates[0], newCoordinates[1],
        inmate->position, php, inmate->currentHealth, inmate->maxHealth, hp, mhp
    );
#endif

    wbkgd(body, COLOR_PAIR(1));

    currentCoordinates = getCoordinate(oldPosition);
    mvwaddch(body, currentCoordinates[0], currentCoordinates[1], type);
    newCoordinates = getCoordinate(inmate->position);
    wbkgd(body, COLOR_PAIR(setColor));
    mvwaddch(body, newCoordinates[0], newCoordinates[1], inmate->type);
    wbkgd(body, COLOR_PAIR (1));
}